

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

uint64_t shuff_one_pass_freq_count
                   (uint32_t *input_u32,uint64_t input_size,uint64_t *freq,uint64_t *syms,
                   uint64_t ms)

{
  uint32_t *puVar1;
  long lVar2;
  uint64_t *up;
  uint64_t *puVar3;
  ulong uVar4;
  uint64_t uVar5;
  
  for (puVar3 = freq; puVar3 <= freq + ms; puVar3 = puVar3 + 1) {
    *puVar3 = 0;
  }
  puVar1 = input_u32 + input_size;
  lVar2 = 0;
  for (; input_u32 < puVar1; input_u32 = input_u32 + 1) {
    uVar4 = (ulong)(*input_u32 + 1);
    uVar5 = freq[uVar4];
    if (uVar5 == 0) {
      syms[lVar2] = uVar4;
      lVar2 = lVar2 + 1;
      uVar5 = freq[uVar4];
    }
    freq[uVar4] = uVar5 + 1;
  }
  *freq = 1;
  syms[lVar2] = 0;
  return lVar2 + 1;
}

Assistant:

uint64_t shuff_one_pass_freq_count(const uint32_t* input_u32,
    uint64_t input_size, uint64_t* freq, uint64_t* syms, uint64_t ms)
{
    uint64_t n;
    uint64_t* up;
    const uint32_t* cup;

    /* clear all elements up to max_symbol = ms */
    for (up = freq; up <= freq + ms; up++)
        *up = 0;

    n = 0;
    for (cup = input_u32; cup < input_u32 + input_size; cup++) {
        if (freq[*cup + 1] == 0)
            syms[n++] = *cup + 1;
        freq[*cup + 1]++;
    }
    freq[0] = 1;
    syms[n++] = 0;

    return n;
}